

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O3

cpu_epc_t cpuid_get_epc(int index,cpu_raw_data_t *raw)

{
  cpu_epc_t cVar1;
  uint32_t regs [4];
  ulong local_18;
  ulong uStack_10;
  
  if (index < 2 && raw != (cpu_raw_data_t *)0x0) {
    local_18 = *(ulong *)raw->intel_fn12h[(int)(index + 2U)];
    uStack_10 = *(ulong *)(raw->intel_fn12h[(int)(index + 2U)] + 2);
  }
  else {
    local_18 = 0x12;
    uStack_10 = (ulong)(index + 2U);
    cpu_exec_cpuid_ext((uint32_t *)&local_18);
  }
  if (((uint)local_18 & 0xf) == 1) {
    local_18 = local_18 & 0xffffffffff000;
    uStack_10 = uStack_10 & 0xffffffffff000;
  }
  else {
    uStack_10 = 0;
    local_18 = 0;
  }
  cVar1.length = uStack_10;
  cVar1.start_addr = local_18;
  return cVar1;
}

Assistant:

struct cpu_epc_t cpuid_get_epc(int index, const struct cpu_raw_data_t* raw)
{
	uint32_t regs[4];
	struct cpu_epc_t retval = {0, 0};
	if (raw && index < MAX_INTELFN12H_LEVEL - 2) {
		// this was queried already, use the data:
		memcpy(regs, raw->intel_fn12h[2 + index], sizeof(regs));
	} else {
		// query this ourselves:
		regs[0] = 0x12;
		regs[2] = 2 + index;
		regs[1] = regs[3] = 0;
		cpu_exec_cpuid_ext(regs);
	}

	// decode values:
	if ((regs[0] & 0xf) == 0x1) {
		retval.start_addr |= (regs[0] & 0xfffff000); // bits [12, 32) -> bits [12, 32)
		retval.start_addr |= ((uint64_t) (regs[1] & 0x000fffff)) << 32; // bits [0, 20) -> bits [32, 52)
		retval.length     |= (regs[2] & 0xfffff000); // bits [12, 32) -> bits [12, 32)
		retval.length     |= ((uint64_t) (regs[3] & 0x000fffff)) << 32; // bits [0, 20) -> bits [32, 52)
	}
	return retval;
}